

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O3

NodeRef __thiscall slang::IntervalMapDetails::Path::getRightSibling(Path *this,uint32_t level)

{
  pointer pEVar1;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> PVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint32_t uVar7;
  int iVar8;
  
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  iVar8 = -1;
  iVar3 = 0;
  do {
    iVar4 = iVar3;
    if (level - 1 == iVar4) {
      uVar5 = pEVar1->offset;
      uVar7 = pEVar1->size - 1;
      uVar6 = 0;
      goto LAB_003c6104;
    }
    uVar5 = pEVar1[level + iVar8].offset;
    uVar7 = pEVar1[level + iVar8].size - 1;
    iVar8 = iVar8 + -1;
    iVar3 = iVar4 + 1;
  } while (uVar5 == uVar7);
  uVar6 = (ulong)(level - (iVar4 + 1));
LAB_003c6104:
  if (uVar5 != uVar7) {
    PVar2.value = *(ulong *)((long)pEVar1[uVar6].node + (ulong)(uVar5 + 1) * 8);
    for (; iVar4 != 0; iVar4 = iVar4 + -1) {
      PVar2.value = *(ulong *)(PVar2.value & 0xffffffffffffffc0);
    }
    return (NodeRef)(PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar2.value;
  }
  return (NodeRef)0;
}

Assistant:

NodeRef Path::getRightSibling(uint32_t level) const {
    SLANG_ASSERT(level > 0);

    // Go up until we can go right.
    uint32_t l = level - 1;
    while (l && path[l].offset == path[l].size - 1)
        --l;

    // If we hit the root there is no right sibling.
    if (path[l].offset == path[l].size - 1)
        return NodeRef();

    // Start with right subtree and go down to the left
    // until we reach the original level.
    NodeRef node = path[l].childAt(path[l].offset + 1);
    for (++l; l != level; ++l)
        node = node.childAt(0);
    return node;
}